

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

int Bac_PtrMemoryArrayArray(Vec_Ptr_t *vArrayArray)

{
  int iVar1;
  Vec_Ptr_t *vArray_00;
  undefined4 local_20;
  undefined4 local_1c;
  int nBytes;
  int i;
  Vec_Ptr_t *vArray;
  Vec_Ptr_t *vArrayArray_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(vArrayArray), local_1c < iVar1; local_1c = local_1c + 1) {
    vArray_00 = (Vec_Ptr_t *)Vec_PtrEntry(vArrayArray,local_1c);
    iVar1 = Bac_PtrMemoryArray(vArray_00);
    local_20 = iVar1 + local_20;
  }
  return local_20;
}

Assistant:

int Bac_PtrMemoryArrayArray( Vec_Ptr_t * vArrayArray )
{
    Vec_Ptr_t * vArray; int i, nBytes = 0;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vArrayArray, vArray, i )
        nBytes += Bac_PtrMemoryArray(vArray);
    return nBytes;
}